

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::(anonymous_namespace)::ToCamelCase_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view input,
          bool lower_first)

{
  byte *pbVar1;
  string *psVar2;
  Nonnull<const_char_*> failure_msg;
  _anonymous_namespace_ *p_Var3;
  LogMessageFatal local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (this != (_anonymous_namespace_ *)0x0) {
    p_Var3 = (_anonymous_namespace_ *)0x0;
    do {
      if (p_Var3[input._M_len] != (_anonymous_namespace_)0x5f) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      p_Var3 = p_Var3 + 1;
    } while (this != p_Var3);
  }
  if (((char)input._M_str != '\0') && (__return_storage_ptr__->_M_string_length != 0)) {
    pbVar1 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
    *pbVar1 = absl::lts_20250127::ascii_internal::kToLower[*pbVar1];
  }
  if (this == (_anonymous_namespace_ *)0x0) {
    psVar2 = (string *)0x0;
  }
  else {
    p_Var3 = (_anonymous_namespace_ *)0x0;
    psVar2 = (string *)0x0;
    do {
      psVar2 = (string *)
               ((long)&(psVar2->_M_dataplus)._M_p +
               (ulong)(p_Var3[input._M_len] == (_anonymous_namespace_)0x5f));
      p_Var3 = p_Var3 + 1;
    } while (this != p_Var3);
  }
  if ((long)this - (long)psVar2 == __return_storage_ptr__->_M_string_length) {
    return psVar2;
  }
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                          ((long)this - (long)psVar2,__return_storage_ptr__->_M_string_length,
                           "CamelCaseSize(input) == result.size()");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x7f,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

std::string ToCamelCase(const absl::string_view input, bool lower_first) {
  bool capitalize_next = !lower_first;
  std::string result;
  result.reserve(input.size());

  for (char character : input) {
    if (character == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(absl::ascii_toupper(character));
      capitalize_next = false;
    } else {
      result.push_back(character);
    }
  }

  // Lower-case the first letter.
  if (lower_first && !result.empty()) {
    result[0] = absl::ascii_tolower(result[0]);
  }

  ABSL_DCHECK_EQ(CamelCaseSize(input), result.size());

  return result;
}